

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void tplt_print(FILE *out,lemon *lemp,char *str,int *lineno)

{
  char *pcVar1;
  int iVar2;
  char cVar3;
  
  if (str != (char *)0x0) {
    cVar3 = *str;
    while (cVar3 != '\0') {
      putc((int)cVar3,(FILE *)out);
      if (*str == '\n') {
        *lineno = *lineno + 1;
      }
      pcVar1 = str + 1;
      str = str + 1;
      cVar3 = *pcVar1;
    }
    if (str[-1] != '\n') {
      putc(10,(FILE *)out);
      *lineno = *lineno + 1;
    }
    if (lemp->nolinenosflag == 0) {
      iVar2 = *lineno;
      *lineno = iVar2 + 1;
      tplt_linedir(out,iVar2 + 1,lemp->outname);
      return;
    }
  }
  return;
}

Assistant:

PRIVATE void tplt_print(FILE *out, struct lemon *lemp, char *str, int *lineno)
{
  if( str==0 ) return;
  while( *str ){
    putc(*str,out);
    if( *str=='\n' ) (*lineno)++;
    str++;
  }
  if( str[-1]!='\n' ){
    putc('\n',out);
    (*lineno)++;
  }
  if (!lemp->nolinenosflag) {
    (*lineno)++; tplt_linedir(out,*lineno,lemp->outname);
  }
  return;
}